

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O3

void lh_rebucket(_LHASH *lh,size_t new_num_buckets)

{
  size_t sVar1;
  lhash_item_st *plVar2;
  LHASH_ITEM *pLVar3;
  LHASH_ITEM **ppLVar4;
  ulong uVar5;
  size_t sVar6;
  
  if ((new_num_buckets >> 0x3d == 0) &&
     (ppLVar4 = (LHASH_ITEM **)OPENSSL_zalloc(new_num_buckets * 8), ppLVar4 != (LHASH_ITEM **)0x0))
  {
    sVar1 = lh->num_buckets;
    if (sVar1 != 0) {
      sVar6 = 0;
      do {
        pLVar3 = lh->buckets[sVar6];
        while (pLVar3 != (LHASH_ITEM *)0x0) {
          uVar5 = (ulong)pLVar3->hash % new_num_buckets;
          plVar2 = pLVar3->next;
          pLVar3->next = ppLVar4[uVar5];
          ppLVar4[uVar5] = pLVar3;
          pLVar3 = plVar2;
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != sVar1);
    }
    OPENSSL_free(lh->buckets);
    lh->num_buckets = new_num_buckets;
    lh->buckets = ppLVar4;
  }
  return;
}

Assistant:

static void lh_rebucket(_LHASH *lh, const size_t new_num_buckets) {
  LHASH_ITEM **new_buckets, *cur, *next;
  size_t i, alloc_size;

  alloc_size = sizeof(LHASH_ITEM *) * new_num_buckets;
  if (alloc_size / sizeof(LHASH_ITEM *) != new_num_buckets) {
    return;
  }

  new_buckets = reinterpret_cast<LHASH_ITEM **>(OPENSSL_zalloc(alloc_size));
  if (new_buckets == NULL) {
    return;
  }

  for (i = 0; i < lh->num_buckets; i++) {
    for (cur = lh->buckets[i]; cur != NULL; cur = next) {
      const size_t new_bucket = cur->hash % new_num_buckets;
      next = cur->next;
      cur->next = new_buckets[new_bucket];
      new_buckets[new_bucket] = cur;
    }
  }

  OPENSSL_free(lh->buckets);

  lh->num_buckets = new_num_buckets;
  lh->buckets = new_buckets;
}